

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O3

bool __thiscall pbrt::Atoi(pbrt *this,string_view str,int *ptr)

{
  int iVar1;
  long *__nptr;
  int *piVar2;
  long lVar3;
  undefined8 uVar4;
  long *local_58 [2];
  long local_48 [2];
  long *local_38;
  
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,str._M_len,this + str._M_len);
  __nptr = local_58[0];
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  *piVar2 = 0;
  lVar3 = strtol((char *)__nptr,(char **)&local_38,10);
  if (local_38 == __nptr) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((int)lVar3 == lVar3) && (*piVar2 != 0x22)) {
    if (*piVar2 == 0) {
      *piVar2 = iVar1;
    }
    *(int *)str._M_str = (int)lVar3;
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    return true;
  }
  uVar4 = std::__throw_out_of_range("stoi");
  __cxa_begin_catch(uVar4);
  __cxa_end_catch();
  return false;
}

Assistant:

bool Atoi(std::string_view str, int *ptr) {
    try {
        *ptr = std::stoi(std::string(str.begin(), str.end()));
    } catch (...) {
        return false;
    }
    return true;
}